

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix<double> * __thiscall
Matrix<double>::compile
          (Matrix<double> *__return_storage_ptr__,Matrix<double> *this,uint beg_col,uint end_col)

{
  value_type vVar1;
  const_reference this_00;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *this_01;
  reference pvVar3;
  uint local_2c;
  uint local_28;
  uint j;
  uint i;
  uint end_col_local;
  uint beg_col_local;
  Matrix<double> *this_local;
  Matrix<double> *matrix;
  
  Matrix(__return_storage_ptr__,(this->m_shape).n_row,end_col - beg_col);
  for (local_28 = 0; local_2c = beg_col, local_28 < (__return_storage_ptr__->m_shape).n_row;
      local_28 = local_28 + 1) {
    for (; local_2c < end_col; local_2c = local_2c + 1) {
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&this->m_elems,(ulong)local_28);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_2c);
      vVar1 = *pvVar2;
      this_01 = operator[](__return_storage_ptr__,local_28);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_01,(ulong)(local_2c - beg_col));
      *pvVar3 = vVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T> Matrix<T>::compile(unsigned beg_col, unsigned end_col) const{
    Matrix<T> matrix(m_shape.n_row, end_col-beg_col);

    for(unsigned i=0;i<matrix.m_shape.n_row;++i){
        for(unsigned j=beg_col;j<end_col;++j){
            matrix[i][j-beg_col]=m_elems[i][j];
        }
    }

    return matrix;
}